

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O3

wchar_t pfdistances_to_path(pfdistances *a,loc_conflict grid,int16_t **step_dirs)

{
  _Bool _Var1;
  uint uVar2;
  wchar_t wVar3;
  loc_conflict lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int16_t *local_50;
  
  if (-1 < (long)grid && a != (pfdistances *)0x0) {
    uVar7 = (ulong)grid >> 0x20;
    wVar3 = grid.x;
    if (((L'\xffffffff' < wVar3 && grid.y < a->height) && (wVar3 < a->width)) &&
       (-1 < a->rows[uVar7][(uint)(wVar3 & 0x7fffffff)])) {
      _Var1 = loc_eq(grid,a->start);
      if (!_Var1) {
        iVar5 = grid.y - (a->start).y;
        iVar9 = -iVar5;
        if (0 < iVar5) {
          iVar9 = iVar5;
        }
        iVar6 = wVar3 - (a->start).x;
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        local_50 = (int16_t *)mem_alloc((ulong)((iVar9 + iVar5) * 2 + 4));
        _Var1 = loc_eq(grid,a->start);
        if (_Var1) {
          uVar10 = 0;
        }
        else {
          uVar2 = iVar9 + iVar5 + 2;
          uVar10 = 0;
          do {
            iVar9 = a->rows[(int)uVar7][grid.x];
            uVar8 = 0xffffffff;
            uVar7 = 0;
            do {
              lVar4 = loc_sum(grid,(loc_conflict)ddgrid_ddd[uVar7]);
              if ((((long)lVar4 < 0) || (wVar3 = lVar4.x, wVar3 < L'\0')) ||
                 ((a->height <= lVar4.y || (a->width <= wVar3)))) {
                __assert_fail("next.y >= 0 && next.y < a->height && next.x >= 0 && next.x < a->width"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                              ,0x247,
                              "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                             );
              }
              iVar5 = a->rows[(ulong)lVar4 >> 0x20][(uint)(wVar3 & 0x7fffffff)];
              if (-1 < iVar5 && iVar5 < iVar9) {
                uVar8 = uVar7 & 0xffffffff;
                iVar9 = iVar5;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != 8);
            if ((int)uVar8 < 0) {
LAB_001ba1ee:
              mem_free(local_50);
              if (step_dirs == (int16_t **)0x0) {
                return L'\xffffffff';
              }
              *step_dirs = (int16_t *)0x0;
              return L'\xffffffff';
            }
            if ((long)(int)uVar2 < (long)uVar10) {
              __assert_fail("length <= allocated && allocated > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                            ,0x25a,
                            "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                           );
            }
            if (uVar10 == uVar2) {
              if (0x3fffffff < (int)uVar2) goto LAB_001ba1ee;
              local_50 = (int16_t *)mem_realloc(local_50,(ulong)(uVar2 << 2));
              uVar2 = uVar2 * 2;
            }
            local_50[uVar10] = 10 - ddd[uVar8];
            uVar10 = uVar10 + 1;
            grid = loc_sum(grid,(loc_conflict)ddgrid_ddd[uVar8]);
            uVar7 = (ulong)grid >> 0x20;
            _Var1 = loc_eq(grid,a->start);
          } while (!_Var1);
        }
        if (step_dirs != (int16_t **)0x0) {
          *step_dirs = local_50;
          return (wchar_t)uVar10;
        }
        mem_free(local_50);
        return (wchar_t)uVar10;
      }
      wVar3 = L'\0';
      goto LAB_001ba035;
    }
  }
  wVar3 = L'\xffffffff';
LAB_001ba035:
  if (step_dirs != (int16_t **)0x0) {
    *step_dirs = (int16_t *)0x0;
  }
  return wVar3;
}

Assistant:

int pfdistances_to_path(const struct pfdistances *a, struct loc grid,
		int16_t **step_dirs)
{
	int16_t *steps;
	int allocated, length;

	if (!a || grid.y < 0 || grid.y >= a->height || grid.x < 0 ||
			grid.x >= a->width || a->rows[grid.y][grid.x] < 0) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	if (loc_eq(grid, a->start)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/* Work backwards from the destination to the starting point. */
	allocated = 2 + ABS(grid.y - a->start.y) + ABS(grid.x - a->start.x);
	length = 0;
	steps = mem_alloc(allocated * sizeof(*steps));
	while (!loc_eq(grid, a->start)) {
		int k, best_k = -1, best_distance = a->rows[grid.y][grid.x];

		/* Find the next step. */
		for (k = 0; k < 8; ++k) {
			struct loc next = loc_sum(grid, ddgrid_ddd[k]);
			int try_distance;

			/*
			 * The impassable boundary imposed on the distances
			 * array should mean the trial step is always in bounds.
			 */
			assert(next.y >= 0 && next.y < a->height
				&& next.x >= 0 && next.x < a->width);
			try_distance = a->rows[next.y][next.x];
			if (try_distance >= 0 && best_distance > try_distance) {
				best_distance = try_distance;
				best_k = k;
			}
		}

		/*
		 * Bail out if stepping backwards did not improve the distance.
		 */
		if (best_k < 0) {
			mem_free(steps);
			if (step_dirs) {
				*step_dirs = NULL;
			}
			return -1;
		}

		assert(length <= allocated && allocated > 0);
		if (length == allocated) {
			if (allocated > INT_MAX / 2
					|| (size_t)allocated
					> SIZE_MAX / (2 * sizeof(*steps))) {
				mem_free(steps);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			allocated *= 2;
			steps = mem_realloc(steps, allocated * sizeof(*steps));
		}

		/* Record the opposite of the backward direction. */
		steps[length] = 10 - ddd[best_k];
		++length;

		grid = loc_sum(grid, ddgrid_ddd[best_k]);
	}

	if (step_dirs) {
		*step_dirs = steps;
	} else {
		mem_free(steps);
	}
	return length;
}